

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

qpdf_offset_t __thiscall QPDF::getLinearizationOffset(QPDF *this,QPDFObjGen og)

{
  int iVar1;
  uint uVar2;
  mapped_type *pmVar3;
  qpdf_offset_t qVar4;
  QPDFObjGen og_00;
  QPDFXRefEntry entry;
  string local_58;
  QPDFXRefEntry local_38;
  QPDFObjGen local_20;
  
  local_20 = og;
  pmVar3 = std::
           map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
           ::operator[](&((this->m)._M_t.
                          super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                          .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->xref_table,
                        &local_20);
  local_38.type = pmVar3->type;
  local_38._4_4_ = *(undefined4 *)&pmVar3->field_0x4;
  local_38.field1 = pmVar3->field1;
  local_38.field2 = pmVar3->field2;
  local_38._20_4_ = *(undefined4 *)&pmVar3->field_0x14;
  iVar1 = QPDFXRefEntry::getType(&local_38);
  if (iVar1 == 2) {
    uVar2 = QPDFXRefEntry::getObjStreamNumber(&local_38);
    og_00.gen = 0;
    og_00.obj = uVar2;
    qVar4 = getLinearizationOffset(this,og_00);
  }
  else if (iVar1 == 1) {
    qVar4 = QPDFXRefEntry::getOffset(&local_38);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"getLinearizationOffset called for xref entry not of type 1 or 2"
               ,"");
    stopOnError(this,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    qVar4 = 0;
  }
  return qVar4;
}

Assistant:

qpdf_offset_t
QPDF::getLinearizationOffset(QPDFObjGen og)
{
    QPDFXRefEntry entry = m->xref_table[og];
    qpdf_offset_t result = 0;
    switch (entry.getType()) {
    case 1:
        result = entry.getOffset();
        break;

    case 2:
        // For compressed objects, return the offset of the object stream that contains them.
        result = getLinearizationOffset(QPDFObjGen(entry.getObjStreamNumber(), 0));
        break;

    default:
        stopOnError("getLinearizationOffset called for xref entry not of type 1 or 2");
        break;
    }
    return result;
}